

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

bool __thiscall Potassco::AspifTextInput::parseStatements(AspifTextInput *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte c;
  bool bVar2;
  Data data;
  Data local_50;
  
  ProgramReader::require
            (&this->super_ProgramReader,this->out_ != (AbstractProgram *)0x0,"output not set");
  RuleBuilder::RuleBuilder(&local_50.rule);
  paVar1 = &local_50.symbol.field_2;
  local_50.symbol.field_2._M_local_buf[0] = '\0';
  this->data_ = &local_50;
  local_50.symbol._M_dataplus._M_p = (pointer)paVar1;
  do {
    local_50.symbol._M_string_length = 0;
    c = ProgramReader::peek(&this->super_ProgramReader,true);
    if (c < 0x25) {
      if (c == 0x23) {
        bVar2 = matchDirective(this);
        if (!bVar2) goto LAB_00109ee5;
      }
      else {
        if (c == 0) {
LAB_00109ee5:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50.symbol._M_dataplus._M_p != paVar1) {
            operator_delete(local_50.symbol._M_dataplus._M_p);
          }
          RuleBuilder::~RuleBuilder(&local_50.rule);
          return true;
        }
LAB_00109ebf:
        matchRule(this,c);
      }
    }
    else if (c == 0x25) {
      ProgramReader::skipLine(&this->super_ProgramReader);
    }
    else {
      if (c != 0x2e) goto LAB_00109ebf;
      match(this,".",true);
    }
    RuleBuilder::clear(&local_50.rule);
    *local_50.symbol._M_dataplus._M_p = '\0';
  } while( true );
}

Assistant:

bool AspifTextInput::parseStatements() {
	require(out_ != 0, "output not set");
	Data data;
	data_ = &data;
	for (char c; (c = peek(true)) != 0; data.clear()) {
		if      (c == '.') { match("."); }
		else if (c == '#') { if (!matchDirective()) break; }
		else if (c == '%') { skipLine(); }
		else               { matchRule(c); }
	}
	return true;
}